

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O1

LLVMValueRef CompileLlvmStringLiteral(LlvmCompilationContext *ctx,ExprStringLiteral *node)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  ulong uVar3;
  LLVMValueRef pLVar4;
  
  uVar1 = node->length;
  iVar2 = (*ctx->allocator->_vptr_Allocator[2])();
  memset((void *)CONCAT44(extraout_var,iVar2),0,(ulong)((uVar1 & 0xfffffffc) + 4));
  if (node->length != 0) {
    uVar3 = 0;
    do {
      *(char *)((long)CONCAT44(extraout_var,iVar2) + uVar3) = node->value[uVar3];
      uVar3 = uVar3 + 1;
    } while (uVar3 < node->length);
  }
  pLVar4 = CheckType(ctx,&node->super_ExprBase,(LLVMValueRef)&placeholderValue);
  return pLVar4;
}

Assistant:

LLVMValueRef CompileLlvmStringLiteral(LlvmCompilationContext &ctx, ExprStringLiteral *node)
{
	unsigned size = node->length + 1;

	// Align to 4
	size = (size + 3) & ~3;

	char *value = (char*)ctx.allocator->alloc(size);
	memset(value, 0, size);

	for(unsigned i = 0; i < node->length; i++)
		value[i] = node->value[i];

	LLVMValueRef result = LLVMConstStringInContext(ctx.context, value, size, true);

	return CheckType(ctx, node, result);
}